

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_copy_constructor_Test::VectorSUnitTest_copy_constructor_Test
          (VectorSUnitTest_copy_constructor_Test *this)

{
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_00169c40;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, copy_constructor)
{
    std::vector<std::string> v_raw_src{"0","1","2","3","4"};

    vector_s<std::string, 10> v_src(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 10> vs(v_src);
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string("0"), vs[0]);
    EXPECT_EQ(std::string("1"), vs[1]);
    EXPECT_EQ(std::string("2"), vs[2]);
    EXPECT_EQ(std::string("3"), vs[3]);
    EXPECT_EQ(std::string("4"), vs[4]);

    vector_s<std::string, 10> v_src_move(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 10> vs_move(std::move(v_src_move));
    EXPECT_FALSE(vs_move.empty());
    EXPECT_EQ(5u, vs_move.size());
    EXPECT_EQ(std::string("0"), vs_move[0]);
    EXPECT_EQ(std::string("1"), vs_move[1]);
    EXPECT_EQ(std::string("2"), vs_move[2]);
    EXPECT_EQ(std::string("3"), vs_move[3]);
    EXPECT_EQ(std::string("4"), vs_move[4]);

    vector_s<std::string, 12> vs_diff_capacity(v_src);
    EXPECT_FALSE(vs_diff_capacity.empty());
    EXPECT_EQ(5u, vs_diff_capacity.size());
    EXPECT_EQ(std::string("0"), vs_diff_capacity[0]);
    EXPECT_EQ(std::string("1"), vs_diff_capacity[1]);
    EXPECT_EQ(std::string("2"), vs_diff_capacity[2]);
    EXPECT_EQ(std::string("3"), vs_diff_capacity[3]);
    EXPECT_EQ(std::string("4"), vs_diff_capacity[4]);

    vector_s<std::string, 10> v_src_move_diff_capacity(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 12> vs_diff_capacity_move(std::move(v_src_move_diff_capacity));
    EXPECT_FALSE(vs_diff_capacity_move.empty());
    EXPECT_EQ(5u, vs_diff_capacity_move.size());
    EXPECT_EQ(std::string("0"), vs_diff_capacity_move[0]);
    EXPECT_EQ(std::string("1"), vs_diff_capacity_move[1]);
    EXPECT_EQ(std::string("2"), vs_diff_capacity_move[2]);
    EXPECT_EQ(std::string("3"), vs_diff_capacity_move[3]);
    EXPECT_EQ(std::string("4"), vs_diff_capacity_move[4]);

}